

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackComponentGroup.h
# Opt level: O2

void __thiscall cmCPackComponent::~cmCPackComponent(cmCPackComponent *this)

{
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Directories);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Files);
  std::_Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::~_Vector_base
            (&(this->ReverseDependencies).
              super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>);
  std::_Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::~_Vector_base
            (&(this->Dependencies).
              super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>);
  std::__cxx11::string::~string((string *)&this->ArchiveFile);
  std::_Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::
  ~_Vector_base(&(this->InstallationTypes).
                 super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
               );
  std::__cxx11::string::~string((string *)&this->Description);
  std::__cxx11::string::~string((string *)&this->DisplayName);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmCPackComponent() : Group(0), IsRequired(true), IsHidden(false),
                      IsDisabledByDefault(false), IsDownloaded(false),
                      TotalSize(0) { }